

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

shared_ptr<mcc::While> __thiscall mcc::Parser::WhileStatement(Parser *this)

{
  Scanner *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  TokenType in_ESI;
  shared_ptr<mcc::While> sVar3;
  shared_ptr<mcc::Stmt> loop_block;
  shared_ptr<mcc::Token> while_token;
  shared_ptr<mcc::Expr> condition;
  bool local_7a;
  undefined1 local_79;
  undefined1 local_78 [32];
  undefined1 local_58 [24];
  element_type *local_40;
  element_type *local_30;
  element_type *local_20;
  
  Consume((Parser *)local_58,in_ESI);
  pSVar1 = (Scanner *)(local_78 + 0x10);
  local_78._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Expected \'(\' after \'while\'","");
  Consume((Parser *)&stack0xffffffffffffffd8,in_ESI,(string *)0x1);
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  if ((Scanner *)local_78._0_8_ != pSVar1) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                      *)local_78._16_8_)->
                                   super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  Expression((Parser *)(local_58 + 0x10),in_ESI);
  local_78._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Expected \')\' after \'while\' condition","");
  Consume((Parser *)&stack0xffffffffffffffc8,in_ESI,(string *)0x2);
  if (local_30 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if ((Scanner *)local_78._0_8_ != pSVar1) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                      *)local_78._16_8_)->
                                   super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  Statement((Parser *)local_78);
  DisallowDecl((shared_ptr<mcc::Stmt> *)local_78,(shared_ptr<mcc::Token> *)local_58);
  local_7a = false;
  std::__shared_ptr<mcc::While,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<mcc::While>,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,std::shared_ptr<mcc::Stmt>&,bool>
            ((__shared_ptr<mcc::While,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<mcc::While> *)&local_79,(shared_ptr<mcc::Token> *)local_58,
             (shared_ptr<mcc::Expr> *)(local_58 + 0x10),(shared_ptr<mcc::Stmt> *)local_78,&local_7a)
  ;
  _Var2._M_pi = extraout_RDX;
  if ((ErrorReporter *)local_78._8_8_ != (ErrorReporter *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_40 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var2._M_pi = extraout_RDX_02;
  }
  sVar3.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::While>)sVar3.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<While> Parser::WhileStatement() {
  std::shared_ptr<Token> while_token = Consume(TokenType::T_WHILE);
  Consume(TokenType::T_LPAREN, "Expected '(' after 'while'");
  std::shared_ptr<Expr> condition = Expression(0);
  Consume(TokenType::T_RPAREN, "Expected ')' after 'while' condition");
  std::shared_ptr<Stmt> loop_block = Statement();
  DisallowDecl(loop_block, while_token);
  return std::make_shared<While>(while_token, condition, loop_block, false);
}